

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O2

size_t __thiscall
hrvo::Simulator::addAgent
          (Simulator *this,Vector2 *position,size_t goalNo,float neighborDist,size_t maxNeighbors,
          float radius,float goalRadius,float prefSpeed,float maxSpeed,float uncertaintyOffset,
          float maxAccel,Vector2 *velocity,float orientation)

{
  Agent *this_00;
  Agent *agent;
  Agent *local_38;
  
  this_00 = (Agent *)operator_new(0xd8);
  Agent::Agent(this_00,this,position,goalNo,neighborDist,maxNeighbors,radius,velocity,maxAccel,
               goalRadius,prefSpeed,maxSpeed,orientation,uncertaintyOffset);
  local_38 = this_00;
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::push_back(&this->agents_,&local_38);
  return ((long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo,
                                float neighborDist, std::size_t maxNeighbors,
                                float radius, float goalRadius, float prefSpeed,
                                float maxSpeed,
#if HRVO_DIFFERENTIAL_DRIVE
                                float timeToOrientation, float wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                float uncertaintyOffset, float maxAccel,
                                const Vector2 &velocity, float orientation) {
  Agent *const agent = new Agent(this, position, goalNo, neighborDist,
                                 maxNeighbors, radius, velocity, maxAccel,
                                 goalRadius, prefSpeed, maxSpeed, orientation,
#if HRVO_DIFFERENTIAL_DRIVE
                                 timeToOrientation, wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                 uncertaintyOffset);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}